

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O1

bool lunasvg::parseUrlValue(string_view *input,string *value)

{
  char cVar1;
  byte *pbVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  string_view local_28;
  
  local_28._M_len = 3;
  local_28._M_str = "url";
  bVar3 = skipString(input,&local_28);
  if (!bVar3) {
    return false;
  }
  sVar4 = input->_M_len;
  bVar3 = sVar4 != 0;
  if (bVar3) {
    bVar3 = true;
    pbVar2 = (byte *)input->_M_str;
    do {
      sVar4 = sVar4 - 1;
      if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
      input->_M_str = (char *)(pbVar2 + 1);
      bVar3 = sVar4 != 0;
      input->_M_len = sVar4;
      pbVar2 = pbVar2 + 1;
    } while (sVar4 != 0);
  }
  if (!bVar3) {
    return false;
  }
  sVar4 = input->_M_len;
  if (sVar4 == 0) {
    return false;
  }
  if (*input->_M_str != '(') {
    return false;
  }
  input->_M_str = input->_M_str + 1;
  bVar3 = sVar4 - 1 != 0;
  input->_M_len = sVar4 - 1;
  if (bVar3) {
    sVar4 = sVar4 - 2;
    bVar3 = true;
    pbVar2 = (byte *)input->_M_str;
    do {
      if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
      input->_M_str = (char *)(pbVar2 + 1);
      bVar3 = sVar4 != 0;
      input->_M_len = sVar4;
      bVar7 = sVar4 != 0;
      sVar4 = sVar4 - 1;
      pbVar2 = pbVar2 + 1;
    } while (bVar7);
  }
  if (!bVar3) {
    return false;
  }
  pcVar5 = input->_M_str;
  cVar1 = *pcVar5;
  if ((cVar1 != '\"') && (cVar1 != '\'')) {
    if (cVar1 != '#') {
      return false;
    }
    input->_M_str = pcVar5 + 1;
    while ((input->_M_len = input->_M_len - 1, input->_M_len != 0 && (*input->_M_str != ')'))) {
      std::__cxx11::string::push_back((char)value);
      input->_M_str = input->_M_str + 1;
    }
    goto LAB_001170d4;
  }
  input->_M_str = pcVar5 + 1;
  sVar4 = input->_M_len;
  sVar6 = sVar4 - 1;
  input->_M_len = sVar6;
  if (sVar6 != 0) {
    pcVar5 = pcVar5 + 2;
    sVar4 = sVar4 - 2;
    do {
      if ((0x20 < (ulong)(byte)pcVar5[-1]) ||
         ((0x100002600U >> ((ulong)(byte)pcVar5[-1] & 0x3f) & 1) == 0)) break;
      input->_M_str = pcVar5;
      input->_M_len = sVar4;
      pcVar5 = pcVar5 + 1;
      bVar3 = sVar4 != 0;
      sVar4 = sVar4 - 1;
    } while (bVar3);
  }
  sVar4 = input->_M_len;
  if (sVar4 == 0) {
    return false;
  }
  if (*input->_M_str != '#') {
    return false;
  }
  input->_M_str = input->_M_str + 1;
  while( true ) {
    sVar4 = sVar4 - 1;
    input->_M_len = sVar4;
    if (sVar4 == 0) break;
    if (*input->_M_str == cVar1) {
      pbVar2 = (byte *)input->_M_str;
      goto LAB_0011708e;
    }
    std::__cxx11::string::push_back((char)value);
    input->_M_str = input->_M_str + 1;
    sVar4 = input->_M_len;
  }
  goto LAB_001170ae;
  while( true ) {
    input->_M_str = (char *)(pbVar2 + 1);
    input->_M_len = sVar4;
    pbVar2 = pbVar2 + 1;
    if (sVar4 == 0) break;
LAB_0011708e:
    sVar4 = sVar4 - 1;
    if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
  }
LAB_001170ae:
  if (input->_M_len == 0) {
    return false;
  }
  if (*input->_M_str != cVar1) {
    return false;
  }
  input->_M_str = input->_M_str + 1;
  input->_M_len = input->_M_len - 1;
LAB_001170d4:
  sVar4 = input->_M_len;
  bVar3 = sVar4 != 0;
  if (bVar3) {
    bVar3 = true;
    pbVar2 = (byte *)input->_M_str;
    do {
      sVar4 = sVar4 - 1;
      if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
      input->_M_str = (char *)(pbVar2 + 1);
      bVar3 = sVar4 != 0;
      input->_M_len = sVar4;
      pbVar2 = pbVar2 + 1;
    } while (sVar4 != 0);
  }
  if (((bVar3) && (input->_M_len != 0)) && (*input->_M_str == ')')) {
    input->_M_str = input->_M_str + 1;
    input->_M_len = input->_M_len - 1;
    return true;
  }
  return false;
}

Assistant:

static bool parseUrlValue(std::string_view& input, std::string& value)
{
    if(!skipString(input, "url")
        || !skipOptionalSpaces(input)
        || !skipDelimiter(input, '(')
        || !skipOptionalSpaces(input)) {
        return false;
    }

    switch(input.front()) {
    case '\'':
    case '\"': {
        auto delim = input.front();
        input.remove_prefix(1);
        skipOptionalSpaces(input);
        if(!skipDelimiter(input, '#'))
            return false;
        while(!input.empty() && input.front() != delim) {
            value += input.front();
            input.remove_prefix(1);
        }

        skipOptionalSpaces(input);
        if(!skipDelimiter(input, delim))
            return false;
        break;
    } case '#': {
        input.remove_prefix(1);
        while(!input.empty() && input.front() != ')') {
            value += input.front();
            input.remove_prefix(1);
        }

        break;
    } default:
        return false;
    }

    return skipOptionalSpaces(input) && skipDelimiter(input, ')');
}